

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# variant.hpp
# Opt level: O0

bool goodform::can_be<short>(any *v)

{
  float fVar1;
  bool bVar2;
  short sVar3;
  char *pcVar4;
  short *psVar5;
  int *piVar6;
  long *plVar7;
  uchar *puVar8;
  unsigned_short *puVar9;
  uint *puVar10;
  unsigned_long *puVar11;
  float *pfVar12;
  double *pdVar13;
  double dVar14;
  double dVar15;
  undefined1 local_2a;
  undefined1 local_29;
  double tmp_1;
  float tmp;
  any *v_local;
  
  bVar2 = is<signed_char>(v);
  if (bVar2) {
    pcVar4 = get<signed_char>(v);
    v_local._7_1_ = detail::can_int_fit_value<short,signed_char>(*pcVar4);
  }
  else {
    bVar2 = is<short>(v);
    if (bVar2) {
      psVar5 = get<short>(v);
      v_local._7_1_ = detail::can_int_fit_value<short,short>(*psVar5);
    }
    else {
      bVar2 = is<int>(v);
      if (bVar2) {
        piVar6 = get<int>(v);
        v_local._7_1_ = detail::can_int_fit_value<short,int>(*piVar6);
      }
      else {
        bVar2 = is<long>(v);
        if (bVar2) {
          plVar7 = get<long>(v);
          v_local._7_1_ = detail::can_int_fit_value<short,long>(*plVar7);
        }
        else {
          bVar2 = is<unsigned_char>(v);
          if (bVar2) {
            puVar8 = get<unsigned_char>(v);
            v_local._7_1_ = detail::can_int_fit_value<short,unsigned_char>(*puVar8);
          }
          else {
            bVar2 = is<unsigned_short>(v);
            if (bVar2) {
              puVar9 = get<unsigned_short>(v);
              v_local._7_1_ = detail::can_int_fit_value<short,unsigned_short>(*puVar9);
            }
            else {
              bVar2 = is<unsigned_int>(v);
              if (bVar2) {
                puVar10 = get<unsigned_int>(v);
                v_local._7_1_ = detail::can_int_fit_value<short,unsigned_int>(*puVar10);
              }
              else {
                bVar2 = is<unsigned_long>(v);
                if (bVar2) {
                  puVar11 = get<unsigned_long>(v);
                  v_local._7_1_ = detail::can_int_fit_value<short,unsigned_long>(*puVar11);
                }
                else {
                  bVar2 = is<float>(v);
                  if (bVar2) {
                    pfVar12 = get<float>(v);
                    fVar1 = *pfVar12;
                    dVar14 = std::floor((double)(ulong)(uint)fVar1);
                    local_29 = false;
                    if (SUB84(dVar14,0) == fVar1) {
                      sVar3 = std::numeric_limits<short>::max();
                      local_29 = false;
                      if (fVar1 <= (float)(int)sVar3) {
                        sVar3 = std::numeric_limits<short>::min();
                        local_29 = (float)(int)sVar3 <= fVar1;
                      }
                    }
                    v_local._7_1_ = local_29;
                  }
                  else {
                    bVar2 = is<double>(v);
                    if (bVar2) {
                      pdVar13 = get<double>(v);
                      dVar14 = *pdVar13;
                      dVar15 = floor(dVar14);
                      local_2a = false;
                      if (dVar15 == dVar14) {
                        sVar3 = std::numeric_limits<short>::max();
                        local_2a = false;
                        if (dVar14 <= (double)(int)sVar3) {
                          sVar3 = std::numeric_limits<short>::min();
                          local_2a = (double)(int)sVar3 <= dVar14;
                        }
                      }
                      v_local._7_1_ = local_2a;
                    }
                    else {
                      v_local._7_1_ = is<short>(v);
                    }
                  }
                }
              }
            }
          }
        }
      }
    }
  }
  return v_local._7_1_;
}

Assistant:

bool can_be(const any& v)
  {
    if (std::is_integral<T>::value)
    {
      if (is<std::int8_t>(v)) return detail::can_int_fit_value<T>(get<std::int8_t>(v));
      if (is<std::int16_t>(v)) return detail::can_int_fit_value<T>(get<std::int16_t>(v));
      if (is<std::int32_t>(v)) return detail::can_int_fit_value<T>(get<std::int32_t>(v));
      if (is<std::int64_t>(v)) return detail::can_int_fit_value<T>(get<std::int64_t>(v));
      if (is<std::uint8_t>(v)) return detail::can_int_fit_value<T>(get<std::uint8_t>(v));
      if (is<std::uint16_t>(v)) return detail::can_int_fit_value<T>(get<std::uint16_t>(v));
      if (is<std::uint32_t>(v)) return detail::can_int_fit_value<T>(get<std::uint32_t>(v));
      if (is<std::uint64_t>(v)) return detail::can_int_fit_value<T>(get<std::uint64_t>(v));
      if (is<float>(v))
      {
        float tmp = get<float>(v);
        return std::floor(tmp) == tmp && float(std::numeric_limits<T>::max()) >= tmp && float(std::numeric_limits<T>::min()) <= tmp;
      }
      if (is<double>(v))
      {
        double tmp = get<double>(v);
        return std::floor(tmp) == tmp && double(std::numeric_limits<T>::max()) >= tmp && double(std::numeric_limits<T>::min()) <= tmp;
      }
    }
    else if (std::is_same<T, double>::value)
    {
      return true;
    }
    else if (std::is_same<T, float>::value)
    {
      if (!is<double>(v))
        return true;
      else
      {
        float tmp = float(get<double>(v));
        if (double(tmp) == get<double>(v))
          return true;
      }
    }
    return is<T>(v);
  }